

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

NetlistVariableDeclaration * __thiscall
netlist::Netlist::addVariableDeclaration(Netlist *this,Symbol *symbol)

{
  string_view hierarchicalPath;
  pointer this_00;
  NetlistVariableDeclaration *__u;
  Symbol *in_RDI;
  NetlistVariableDeclaration *node;
  __single_object nodePtr;
  NetlistVariableDeclaration *result;
  string hierPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string_view *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *this_01;
  _Alloc_hider in_stack_ffffffffffffff88;
  Netlist *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> local_38 [6];
  NetlistVariableDeclaration *local_8;
  
  this_01 = local_38;
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_((Symbol *)in_stack_ffffffffffffff88._M_p);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff60);
  hierarchicalPath._M_str._0_4_ = in_stack_ffffffffffffffa0;
  hierarchicalPath._M_len = in_stack_ffffffffffffff98;
  hierarchicalPath._M_str._4_4_ = in_stack_ffffffffffffffa4;
  local_8 = lookupVariable(in_stack_ffffffffffffff90,hierarchicalPath);
  if (local_8 == (NetlistVariableDeclaration *)0x0) {
    std::make_unique<netlist::NetlistVariableDeclaration,slang::ast::Symbol_const&>(in_RDI);
    std::
    unique_ptr<netlist::NetlistVariableDeclaration,_std::default_delete<netlist::NetlistVariableDeclaration>_>
    ::operator->((unique_ptr<netlist::NetlistVariableDeclaration,_std::default_delete<netlist::NetlistVariableDeclaration>_>
                  *)0x192c97);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    this_00 = std::
              unique_ptr<netlist::NetlistVariableDeclaration,_std::default_delete<netlist::NetlistVariableDeclaration>_>
              ::operator->((unique_ptr<netlist::NetlistVariableDeclaration,_std::default_delete<netlist::NetlistVariableDeclaration>_>
                            *)0x192cb4);
    __u = NetlistNode::as<netlist::NetlistVariableDeclaration>(&this_00->super_NetlistNode);
    __x = &in_RDI->name;
    in_stack_ffffffffffffff60 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffff88;
    std::unique_ptr<netlist::NetlistNode,std::default_delete<netlist::NetlistNode>>::
    unique_ptr<netlist::NetlistVariableDeclaration,std::default_delete<netlist::NetlistVariableDeclaration>,void>
              (this_01,(unique_ptr<netlist::NetlistVariableDeclaration,_std::default_delete<netlist::NetlistVariableDeclaration>_>
                        *)__u);
    std::
    vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
    ::push_back((vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>
                 *)in_stack_ffffffffffffff60,(value_type *)__x);
    std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>::~unique_ptr
              ((unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
               in_stack_ffffffffffffff60);
    local_8 = __u;
    std::
    unique_ptr<netlist::NetlistVariableDeclaration,_std::default_delete<netlist::NetlistVariableDeclaration>_>
    ::~unique_ptr((unique_ptr<netlist::NetlistVariableDeclaration,_std::default_delete<netlist::NetlistVariableDeclaration>_>
                   *)in_stack_ffffffffffffff60);
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff60);
  return local_8;
}

Assistant:

NetlistVariableDeclaration& addVariableDeclaration(const ast::Symbol& symbol) {
        std::string hierPath = symbol.getHierarchicalPath();
        if (auto* result = lookupVariable(hierPath)) {
            DEBUG_PRINT("Variable declaration for {} already exists", hierPath);
            return *result;
        }
        else {
            auto nodePtr = std::make_unique<NetlistVariableDeclaration>(symbol);
            nodePtr->hierarchicalPath = hierPath;
            auto& node = nodePtr->as<NetlistVariableDeclaration>();
            nodes.push_back(std::move(nodePtr));
            DEBUG_PRINT("Add var decl {}\n", node.hierarchicalPath);
            return node;
        }
    }